

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::FindFileByName
          (SimpleDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  bool bVar1;
  FileDescriptorProto *file;
  SimpleDescriptorDatabase *this_00;
  
  this_00 = (SimpleDescriptorDatabase *)&this->index_;
  file = DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindFile
                   ((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)this_00,
                    filename);
  bVar1 = MaybeCopy(this_00,file,output);
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::FindFileByName(const std::string& filename,
                                              FileDescriptorProto* output) {
  return MaybeCopy(index_.FindFile(filename), output);
}